

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

HighsStatus calculateColDualsQuad(HighsLp *lp,HighsSolution *solution)

{
  size_type sVar1;
  const_reference pvVar2;
  reference pvVar3;
  const_reference pvVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  long in_RSI;
  int *in_RDI;
  HighsInt row;
  HighsInt i;
  HighsInt col;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> col_dual_quad;
  bool data_error;
  bool is_colwise;
  bool correct_size;
  size_type in_stack_ffffffffffffff38;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *this;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_stack_ffffffffffffff40;
  value_type in_stack_ffffffffffffff48;
  HighsCDouble *in_stack_ffffffffffffff50;
  double in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  byte local_89;
  int local_5c;
  int local_58;
  HighsCDouble local_48;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_38;
  byte local_1b;
  undefined1 local_1a;
  byte local_19;
  long local_18;
  int *local_10;
  HighsStatus local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  sVar1 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x50));
  local_19 = (int)sVar1 == local_10[1];
  local_1a = HighsSparseMatrix::isColwise((HighsSparseMatrix *)(local_10 + 0x20));
  local_89 = 1;
  if ((local_19 & 1) != 0) {
    local_89 = local_1a ^ 0xff;
  }
  local_1b = local_89 & 1;
  if (local_1b == 0) {
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::vector
              ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)0x50218d);
    HighsCDouble::HighsCDouble(&local_48,0.0);
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::assign
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(value_type *)0x5021c9);
    for (local_58 = 0; local_58 < *local_10; local_58 = local_58 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_10 + 0x24),(long)local_58);
      local_5c = *pvVar2;
      while( true ) {
        in_stack_ffffffffffffff64 = local_5c;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_10 + 0x24),
                            (long)(local_58 + 1));
        if (*pvVar2 <= in_stack_ffffffffffffff64) break;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_10 + 0x30),(long)local_5c);
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0x50),
                            (long)*pvVar2);
        in_stack_ffffffffffffff50 = (HighsCDouble *)*pvVar3;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 0x36),
                            (long)local_5c);
        in_stack_ffffffffffffff58 = (double)in_stack_ffffffffffffff50 * *pvVar4;
        std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                  (&local_38,(long)local_58);
        HighsCDouble::operator+=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        local_5c = local_5c + 1;
      }
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 2),(long)local_58);
      in_stack_ffffffffffffff48 = *pvVar4;
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[](&local_38,(long)local_58)
      ;
      HighsCDouble::operator+=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    }
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (size_type)in_stack_ffffffffffffff58);
    this = &local_38;
    iVar5 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::begin(this);
    iVar6 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::end(this);
    iVar7 = std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)this);
    std::
    transform<__gnu_cxx::__normal_iterator<HighsCDouble*,std::vector<HighsCDouble,std::allocator<HighsCDouble>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,calculateColDualsQuad(HighsLp_const&,HighsSolution&)::__0>
              (iVar5._M_current,iVar6._M_current,iVar7._M_current);
    local_4 = kOk;
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::~vector
              ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)in_stack_ffffffffffffff50);
  }
  else {
    local_4 = kError;
  }
  return local_4;
}

Assistant:

HighsStatus calculateColDualsQuad(const HighsLp& lp, HighsSolution& solution) {
  const bool correct_size = int(solution.row_dual.size()) == lp.num_row_;
  const bool is_colwise = lp.a_matrix_.isColwise();
  const bool data_error = !correct_size || !is_colwise;
  assert(!data_error);
  if (data_error) return HighsStatus::kError;

  std::vector<HighsCDouble> col_dual_quad;
  col_dual_quad.assign(lp.num_col_, HighsCDouble{0.0});

  for (HighsInt col = 0; col < lp.num_col_; col++) {
    for (HighsInt i = lp.a_matrix_.start_[col];
         i < lp.a_matrix_.start_[col + 1]; i++) {
      const HighsInt row = lp.a_matrix_.index_[i];
      assert(row >= 0);
      assert(row < lp.num_row_);
      col_dual_quad[col] += solution.row_dual[row] * lp.a_matrix_.value_[i];
    }
    col_dual_quad[col] += lp.col_cost_[col];
  }

  // assign quad values to double vector
  solution.col_dual.resize(lp.num_col_);
  std::transform(col_dual_quad.begin(), col_dual_quad.end(),
                 solution.col_dual.begin(),
                 [](HighsCDouble x) { return double(x); });

  return HighsStatus::kOk;
}